

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_test_driver.h
# Opt level: O0

void __thiscall libaom_test::Decoder::InitOnce(Decoder *this)

{
  bool bVar1;
  aom_codec_err_t aVar2;
  char *message;
  AssertHelper *this_00;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar;
  aom_codec_err_t res;
  char **in_stack_ffffffffffffff68;
  Message *in_stack_ffffffffffffff70;
  aom_codec_err_t *in_stack_ffffffffffffff78;
  Decoder *in_stack_ffffffffffffff80;
  aom_codec_iface_t *iface;
  int line;
  aom_codec_ctx_t *in_stack_ffffffffffffff90;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffff9c;
  Type type;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*(byte *)&(((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&in_RDI[0xb].data_)->_M_t).
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl & 1) == 0) {
    iface = (aom_codec_iface_t *)(in_RDI + 1);
    (**(code **)((((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&in_RDI->data_)->_M_t).
                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl + 0x10))();
    aVar2 = aom_codec_dec_init_ver
                      (in_stack_ffffffffffffff90,iface,
                       (aom_codec_dec_cfg_t *)in_stack_ffffffffffffff80,
                       (aom_codec_flags_t)in_stack_ffffffffffffff78,
                       (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    this_01 = (AssertionResult *)&stack0xffffffffffffffe0;
    testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
              ((char *)iface,(char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (aom_codec_err_t *)in_stack_ffffffffffffff70);
    line = (int)((ulong)iface >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_RDI);
      message = DecodeError(in_stack_ffffffffffffff80);
      testing::Message::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x126c85);
      testing::internal::AssertHelper::AssertHelper(in_RDI,type,&this_01->success_,line,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(aVar2,in_stack_fffffffffffffff0),
                 (Message *)in_stack_ffffffffffffffe8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x126cd3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x126d23);
    if (bVar1) {
      *(undefined1 *)
       &(((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&in_RDI[0xb].data_)->_M_t).
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl = 1;
    }
  }
  return;
}

Assistant:

void InitOnce() {
    if (!init_done_) {
      const aom_codec_err_t res =
          aom_codec_dec_init(&decoder_, CodecInterface(), &cfg_, flags_);
      ASSERT_EQ(AOM_CODEC_OK, res) << DecodeError();
      init_done_ = true;
    }
  }